

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O1

void __thiscall CSocekt::flyd_free_connection(CSocekt *this,lp_connection_t pConn)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  muduo::MutexLock::lock(&this->m_connectionMutex);
  flyd_connection_s::PutOneToFree(pConn);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)pConn;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->m_freeconnectionList).
            super__List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  LOCK();
  (this->m_free_connection_n).value_ = (this->m_free_connection_n).value_ + 1;
  UNLOCK();
  (this->m_connectionMutex).holder_ = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_connectionMutex);
  return;
}

Assistant:

void CSocekt::flyd_free_connection(lp_connection_t pConn)
{
    muduo::MutexLockGuard lock(m_connectionMutex);

    //首先明确一点，连接，所有连接全部都在m_connectionList里；
    pConn->PutOneToFree();

    //扔到空闲连接列表里
    m_freeconnectionList.push_back(pConn);

    //空闲连接数+1
    m_free_connection_n.increment();

    return;
}